

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEDDSA.cpp
# Opt level: O0

bool __thiscall
OSSLEDDSA::reconstructPublicKey(OSSLEDDSA *this,PublicKey **ppPublicKey,ByteString *serialisedData)

{
  uint uVar1;
  size_t sVar2;
  OSSLEDPublicKey *this_00;
  undefined8 in_RDX;
  undefined8 *in_RSI;
  OSSLEDPublicKey *pub;
  
  if ((in_RSI != (undefined8 *)0x0) &&
     (sVar2 = ByteString::size((ByteString *)0x1b6b65), sVar2 != 0)) {
    this_00 = (OSSLEDPublicKey *)operator_new(0x68);
    OSSLEDPublicKey::OSSLEDPublicKey(this_00);
    uVar1 = (*(this_00->super_EDPublicKey).super_PublicKey.super_Serialisable._vptr_Serialisable
              [0xb])(this_00,in_RDX);
    if ((uVar1 & 1) == 0) {
      if (this_00 != (OSSLEDPublicKey *)0x0) {
        (*(this_00->super_EDPublicKey).super_PublicKey.super_Serialisable._vptr_Serialisable[2])();
      }
      return false;
    }
    *in_RSI = this_00;
    return true;
  }
  return false;
}

Assistant:

bool OSSLEDDSA::reconstructPublicKey(PublicKey** ppPublicKey, ByteString& serialisedData)
{
	// Check input
	if ((ppPublicKey == NULL) ||
	    (serialisedData.size() == 0))
	{
		return false;
	}

	OSSLEDPublicKey* pub = new OSSLEDPublicKey();

	if (!pub->deserialise(serialisedData))
	{
		delete pub;

		return false;
	}

	*ppPublicKey = pub;

	return true;
}